

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

matrix3 * matrix3_make_transformation_rotationf_z(matrix3 *m,double angle)

{
  double dVar1;
  double dVar2;
  
  dVar1 = cos(angle);
  dVar2 = sin(angle);
  (m->field_0).m[2] = 0.0;
  (m->field_0).m[4] = 1.0;
  (m->field_0).m[6] = 0.0;
  (m->field_0).m[7] = 0.0;
  (m->field_0).m[8] = 1.0;
  (m->field_0).m[0] = dVar1;
  (m->field_0).m[1] = dVar2;
  (m->field_0).m[3] = -dVar2;
  (m->field_0).m[5] = dVar1;
  return m;
}

Assistant:

HYPAPI struct matrix3 *matrix3_make_transformation_rotationf_z(struct matrix3 *m, HYP_FLOAT angle)
{
	HYP_FLOAT c = HYP_COS(angle);
	HYP_FLOAT s = HYP_SIN(angle);

	matrix3_identity(m);

	m->r00 = c;
	m->r01 = s;
	m->r10 = -s;
	m->r12 = c;

	return m;
}